

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O2

int Rpo_computeMinEdgeCost(Rpo_LCI_Edge_t **edges,int edgeCount,int *vertexDegree)

{
  Rpo_LCI_Edge_t RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar5 = 0;
  uVar6 = (ulong)(uint)edgeCount;
  if (edgeCount < 1) {
    uVar6 = uVar5;
  }
  iVar7 = -1;
  iVar4 = iVar7;
  uVar8 = 0xffffffff;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    RVar1 = *edges[uVar5];
    iVar2 = iVar4;
    uVar11 = uVar8;
    iVar3 = iVar7;
    if (((ulong)RVar1 & 1) == 0) {
      uVar11 = (uint)((ulong)RVar1 >> 4);
      uVar12 = (ulong)(uVar11 & 0x3fffffff);
      uVar10 = (ulong)RVar1 >> 0x22;
      uVar11 = vertexDegree[uVar10] + *(int *)((long)vertexDegree + (ulong)(uVar11 << 2));
      if (uVar12 < uVar10) {
        uVar10 = uVar12;
      }
      iVar9 = (int)uVar10;
      bVar13 = uVar11 == uVar8;
      iVar2 = (int)uVar5;
      iVar3 = iVar9;
      if ((uVar8 <= uVar11) &&
         (iVar2 = iVar4, uVar11 = uVar8, iVar3 = iVar7, bVar13 && iVar9 < iVar7)) {
        iVar2 = (int)uVar5;
        iVar3 = iVar9;
      }
    }
    iVar7 = iVar3;
    iVar4 = iVar2;
    uVar8 = uVar11;
  }
  return iVar4;
}

Assistant:

int Rpo_computeMinEdgeCost(Rpo_LCI_Edge_t** edges, int edgeCount, int* vertexDegree) {
    int minCostIndex = -1;
    int minVertexIndex = -1;
    unsigned int minCost = ~0;
    Rpo_LCI_Edge_t* edge;
    unsigned int edgeCost;
    int minVertex;
    int i;
    for (i = 0; i < edgeCount; ++i) {
        edge = edges[i];
        if (!edge->visited) {
            edgeCost = vertexDegree[edge->idx1] + vertexDegree[edge->idx2];
            minVertex = (edge->idx1 < edge->idx2) ? edge->idx1 : edge->idx2;
            if (edgeCost < minCost) {
                minCost = edgeCost;
                minCostIndex = i;
                minVertexIndex = minVertex;
            } else if ((edgeCost == minCost) && minVertex < minVertexIndex) {
                minCost = edgeCost;
                minCostIndex = i;
                minVertexIndex = minVertex;
            }
        }
    }
    return minCostIndex;
}